

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

plink * Plink_new(void)

{
  plink *ppVar1;
  plink *ppVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  char *pcVar5;
  FILE *pFVar6;
  char *__modes;
  char *pcVar7;
  char *suffix;
  long lVar8;
  lemon *lemp;
  
  if (plink_freelist == (plink *)0x0) {
    lVar8 = 100;
    pcVar7 = (char *)0x10;
    ppVar2 = (plink *)calloc(100,0x10);
    plink_freelist = ppVar2;
    if (ppVar2 == (plink *)0x0) {
      Plink_new_cold_1();
      pcVar5 = *(char **)(lVar8 + 200);
      suffix = pcVar7;
      sVar3 = strlen(pcVar5);
      sVar4 = strlen(pcVar7);
      lemp = (lemon *)(long)((int)sVar4 + (int)sVar3 + 5);
      __dest = (char *)malloc((size_t)lemp);
      if (__dest != (char *)0x0) {
        strcpy(__dest,pcVar5);
        pcVar5 = strrchr(__dest,0x2e);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
        }
        ppVar2 = (plink *)strcat(__dest,pcVar7);
        return ppVar2;
      }
      file_makename_cold_1();
      if (lemp->outname != (char *)0x0) {
        free(lemp->outname);
      }
      pcVar7 = file_makename(lemp,suffix);
      lemp->outname = pcVar7;
      pFVar6 = fopen(pcVar7,__modes);
      if ((pFVar6 == (FILE *)0x0) && (*__modes == 'w')) {
        file_open_cold_1();
        pFVar6 = (FILE *)0x0;
      }
      return (plink *)pFVar6;
    }
    lVar8 = 99;
    ppVar1 = ppVar2;
    do {
      ppVar1->next = ppVar1 + 1;
      lVar8 = lVar8 + -1;
      ppVar1 = ppVar1 + 1;
    } while (lVar8 != 0);
    ppVar2[99].next = (plink *)0x0;
  }
  ppVar2 = plink_freelist;
  plink_freelist = plink_freelist->next;
  return ppVar2;
}

Assistant:

struct plink *Plink_new(){
  struct plink *newlink;

  if( plink_freelist==0 ){
    int i;
    int amt = 100;
    plink_freelist = (struct plink *)calloc( amt, sizeof(struct plink) );
    if( plink_freelist==0 ){
      fprintf(stderr,
      "Unable to allocate memory for a new follow-set propagation link.\n");
      exit(1);
    }
    for(i=0; i<amt-1; i++) plink_freelist[i].next = &plink_freelist[i+1];
    plink_freelist[amt-1].next = 0;
  }
  newlink = plink_freelist;
  plink_freelist = plink_freelist->next;
  return newlink;
}